

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O0

bool __thiscall QHttp2ProtocolHandler::sendRequest(QHttp2ProtocolHandler *this)

{
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  bool bVar1;
  const_iterator this_00;
  QHttp2ProtocolHandler *this_01;
  QHttp2Stream *pQVar2;
  QNonContiguousByteDevice *pQVar3;
  long in_RDI;
  long in_FS_OFFSET;
  QHttpNetworkRequest *request;
  HttpMessagePair *httpPair;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *pair;
  QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *requests;
  QHttp2Stream *stream;
  QUrl promiseKey;
  iterator end;
  iterator it_1;
  iterator endIt;
  iterator it;
  iterator *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  QHttp2Connection *in_stack_fffffffffffffec8;
  QHttp2Stream *in_stack_fffffffffffffed0;
  QHttp2Stream *in_stack_fffffffffffffed8;
  QHttp2Connection *in_stack_fffffffffffffee0;
  const_iterator in_stack_fffffffffffffee8;
  QHttp2Connection *in_stack_fffffffffffffef0;
  undefined4 uVar4;
  NetworkError error;
  QHttpNetworkConnectionChannel *in_stack_ffffffffffffff00;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *in_stack_ffffffffffffff38;
  QHttp2Connection *pQVar5;
  bool local_a9;
  QUrl local_40;
  iterator local_38;
  iterator local_30;
  iterator local_20;
  iterator local_18;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = (undefined4)in_RDI;
  error = (NetworkError)((ulong)in_RDI >> 0x20);
  bVar1 = QHttp2Connection::isGoingAway(*(QHttp2Connection **)(in_RDI + 0x38));
  if (bVar1) {
    QHttpNetworkConnectionChannel::emitFinishedWithError
              (in_stack_ffffffffffffff00,error,(char *)in_stack_fffffffffffffef0);
    QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::clear
              ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    local_a9 = false;
  }
  else {
    this_00._M_node = (_Base_ptr)(*(long *)(CONCAT44(error,uVar4) + 0x18) + 0x80);
    local_10._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
    local_10._M_node =
         (_Base_ptr)
         QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::begin
                   ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                    in_stack_fffffffffffffed0);
    local_18._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
    local_18._M_node =
         (_Base_ptr)
         QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::end
                   ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                    in_stack_fffffffffffffed0);
    do {
      while( true ) {
        bVar1 = ::operator!=((iterator *)
                             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                             in_stack_fffffffffffffeb8);
        if (!bVar1) {
          bVar1 = QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::empty
                            ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *
                             )0x2d1374);
          if (!bVar1) {
            *(undefined4 *)(*(long *)(CONCAT44(error,uVar4) + 0x18) + 0x20) = 2;
            local_30._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
            local_30._M_node =
                 (_Base_ptr)
                 QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::begin
                           ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                            in_stack_fffffffffffffed0);
            local_38._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
            local_38._M_node =
                 (_Base_ptr)
                 QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::end
                           ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                            in_stack_fffffffffffffed0);
            goto LAB_002d13df;
          }
          local_a9 = true;
          goto LAB_002d1759;
        }
        in_stack_ffffffffffffff38 =
             QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::iterator::
             operator*((iterator *)0x2d12aa);
        bVar1 = QHttpNetworkRequest::isPreConnect((QHttpNetworkRequest *)0x2d12bf);
        if (bVar1) break;
        QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::iterator::operator++
                  ((iterator *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      }
      QHttpNetworkConnection::preConnectFinished((QHttpNetworkConnection *)0x2d12d6);
      in_stack_fffffffffffffef0 = (QHttp2Connection *)this_00._M_node;
      QHttpNetworkReply::finished((QHttpNetworkReply *)0x2d12e7);
      this_00._M_node = (_Base_ptr)in_stack_fffffffffffffef0;
      QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::const_iterator::
      const_iterator((const_iterator *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
                     ,in_stack_fffffffffffffeb8);
      local_20._M_node =
           (_Base_ptr)
           QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::erase
                     ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                      in_stack_fffffffffffffec8,in_stack_fffffffffffffee8._M_node);
      local_10._M_node = local_20._M_node;
      bVar1 = QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::empty
                        ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                         0x2d1340);
    } while (!bVar1);
    local_a9 = true;
  }
  goto LAB_002d1759;
  while( true ) {
    this_01 = (QHttp2ProtocolHandler *)
              QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::iterator::
              operator*((iterator *)0x2d1419);
    local_40.d = (QUrlPrivate *)0xaaaaaaaaaaaaaaaa;
    anon_unknown.dwarf_657c77::urlkey_from_request((QHttpNetworkRequest *)in_stack_fffffffffffffec8)
    ;
    pQVar2 = QHttp2Connection::promisedStream
                       (in_stack_fffffffffffffec8,
                        (QUrl *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    if (pQVar2 == (QHttp2Stream *)0x0) {
      pQVar2 = createNewStream((QHttp2ProtocolHandler *)this_00._M_node,in_stack_ffffffffffffff38,
                               SUB81((ulong)this_01 >> 0x38,0));
      if (pQVar2 == (QHttp2Stream *)0x0) {
        bVar1 = QHttpNetworkReply::isFinished((QHttpNetworkReply *)0x2d14fd);
        if (bVar1) {
          pQVar5 = (QHttp2Connection *)this_00._M_node;
          QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::const_iterator::
          const_iterator((const_iterator *)
                         CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                         in_stack_fffffffffffffeb8);
          local_30._M_node =
               (_Base_ptr)
               QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::erase
                         ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                          in_stack_fffffffffffffec8,in_stack_fffffffffffffee8._M_node);
          in_stack_fffffffffffffee0 = (QHttp2Connection *)this_00._M_node;
          this_00._M_node = (_Base_ptr)pQVar5;
        }
        in_stack_fffffffffffffec4 = 4;
        pQVar2 = in_stack_fffffffffffffed0;
      }
      else {
        in_stack_ffffffffffffff20 =
             QHash<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::operator[]
                       ((QHash<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>
                         *)in_stack_fffffffffffffed0,(QHttp2Stream **)in_stack_fffffffffffffec8);
        bVar1 = sendHEADERS((QHttp2ProtocolHandler *)in_stack_fffffffffffffee8._M_node,
                            (QHttp2Stream *)in_stack_fffffffffffffee0,
                            (QHttpNetworkRequest *)in_stack_fffffffffffffed8);
        if (bVar1) {
          pQVar3 = QHttpNetworkRequest::uploadByteDevice((QHttpNetworkRequest *)0x2d1620);
          if ((pQVar3 == (QNonContiguousByteDevice *)0x0) ||
             (bVar1 = sendDATA((QHttp2ProtocolHandler *)in_stack_fffffffffffffee0,
                               in_stack_fffffffffffffed8,
                               (QHttpNetworkReply *)in_stack_fffffffffffffed0), bVar1)) {
            in_stack_fffffffffffffec8 = (QHttp2Connection *)this_00._M_node;
            pQVar2 = in_stack_fffffffffffffed0;
            this_00._M_node = (_Base_ptr)in_stack_fffffffffffffec8;
            QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::const_iterator::
            const_iterator((const_iterator *)
                           CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                           in_stack_fffffffffffffeb8);
            local_30._M_node =
                 (_Base_ptr)
                 QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::erase
                           ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                            in_stack_fffffffffffffec8,in_stack_fffffffffffffee8._M_node);
            in_stack_fffffffffffffec4 = 0;
          }
          else {
            Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_stack_fffffffffffffec8,
                       CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
            latin1_00.m_data._0_4_ = uVar4;
            latin1_00.m_size = (qsizetype)in_stack_fffffffffffffef0;
            latin1_00.m_data._4_4_ = error;
            QString::QString((QString *)pQVar2,latin1_00);
            finishStreamWithError
                      ((QHttp2ProtocolHandler *)in_stack_fffffffffffffee0,
                       (QHttp2Stream *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                       ,(NetworkError)((ulong)in_stack_fffffffffffffed8 >> 0x20),(QString *)pQVar2);
            QString::~QString((QString *)0x2d16b1);
            in_stack_fffffffffffffec4 = 5;
          }
        }
        else {
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_fffffffffffffec8,
                     CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
          latin1.m_data._0_4_ = uVar4;
          latin1.m_size = (qsizetype)in_stack_fffffffffffffef0;
          latin1.m_data._4_4_ = error;
          QString::QString((QString *)in_stack_fffffffffffffed0,latin1);
          finishStreamWithError
                    ((QHttp2ProtocolHandler *)in_stack_fffffffffffffee0,
                     (QHttp2Stream *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                     (NetworkError)((ulong)pQVar2 >> 0x20),(QString *)in_stack_fffffffffffffed0);
          in_stack_fffffffffffffed8 = pQVar2;
          QString::~QString((QString *)0x2d1609);
          in_stack_fffffffffffffec4 = 5;
          pQVar2 = in_stack_fffffffffffffed0;
        }
      }
    }
    else {
      in_stack_fffffffffffffee8._M_node = this_00._M_node;
      initReplyFromPushPromise
                (this_01,(HttpMessagePair *)
                         CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                 (QUrl *)in_stack_ffffffffffffff20);
      this_00._M_node = in_stack_fffffffffffffee8._M_node;
      QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::const_iterator::
      const_iterator((const_iterator *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
                     ,in_stack_fffffffffffffeb8);
      local_30._M_node =
           (_Base_ptr)
           QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::erase
                     ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                      in_stack_fffffffffffffec8,in_stack_fffffffffffffee8._M_node);
      in_stack_fffffffffffffec4 = 5;
      pQVar2 = in_stack_fffffffffffffed0;
    }
    QUrl::~QUrl(&local_40);
    in_stack_fffffffffffffed0 = pQVar2;
    in_stack_ffffffffffffff2c = in_stack_fffffffffffffec4;
    if ((in_stack_fffffffffffffec4 != 0) && (in_stack_fffffffffffffec4 == 4)) break;
LAB_002d13df:
    bVar1 = ::operator!=((iterator *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                         in_stack_fffffffffffffeb8);
    if (!bVar1) break;
  }
  *(undefined4 *)(*(long *)(CONCAT44(error,uVar4) + 0x18) + 0x20) = 0;
  local_a9 = true;
LAB_002d1759:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_a9;
}

Assistant:

bool QHttp2ProtocolHandler::sendRequest()
{
    if (h2Connection->isGoingAway()) {
        // Stop further calls to this method: we have received GOAWAY
        // so we cannot create new streams.
        m_channel->emitFinishedWithError(QNetworkReply::ProtocolUnknownError,
                                         "GOAWAY received, cannot start a request");
        m_channel->h2RequestsToSend.clear();
        return false;
    }

    // Process 'fake' (created by QNetworkAccessManager::connectToHostEncrypted())
    // requests first:
    auto &requests = m_channel->h2RequestsToSend;
    for (auto it = requests.begin(), endIt = requests.end(); it != endIt;) {
        const auto &pair = *it;
        if (pair.first.isPreConnect()) {
            m_connection->preConnectFinished();
            emit pair.second->finished();
            it = requests.erase(it);
            if (requests.empty()) {
                // Normally, after a connection was established and H2
                // was negotiated, we send a client preface. connectToHostEncrypted
                // though is not meant to send any data, it's just a 'preconnect'.
                // Thus we return early:
                return true;
            }
        } else {
            ++it;
        }
    }

    if (requests.empty())
        return true;

    m_channel->state = QHttpNetworkConnectionChannel::WritingState;
    // Check what was promised/pushed, maybe we do not have to send a request
    // and have a response already?

    for (auto it = requests.begin(), end = requests.end(); it != end;) {
        HttpMessagePair &httpPair = *it;

        QUrl promiseKey = urlkey_from_request(httpPair.first);
        if (h2Connection->promisedStream(promiseKey) != nullptr) {
            // There's a PUSH_PROMISE for this request, so we don't send one
            initReplyFromPushPromise(httpPair, promiseKey);
            it = requests.erase(it);
            continue;
        }

        QHttp2Stream *stream = createNewStream(httpPair);
        if (!stream) { // There was an issue creating the stream
            // Check if it was unrecoverable, ie. the reply is errored out and finished:
            if (httpPair.second->isFinished()) {
                it = requests.erase(it);
            }
            // ... either way we stop looping:
            break;
        }

        QHttpNetworkRequest &request = requestReplyPairs[stream].first;
        if (!sendHEADERS(stream, request)) {
            finishStreamWithError(stream, QNetworkReply::UnknownNetworkError,
                    "failed to send HEADERS frame(s)"_L1);
            continue;
        }
        if (request.uploadByteDevice()) {
            if (!sendDATA(stream, httpPair.second)) {
                finishStreamWithError(stream, QNetworkReply::UnknownNetworkError,
                                      "failed to send DATA frame(s)"_L1);
                continue;
            }
        }
        it = requests.erase(it);
    }

    m_channel->state = QHttpNetworkConnectionChannel::IdleState;

    return true;
}